

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

size_t ra_portable_size_in_bytes(roaring_array_t *ra)

{
  uint32_t uVar1;
  int32_t iVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  uVar1 = ra_portable_header_size(ra);
  sVar4 = (size_t)uVar1;
  uVar3 = 0;
  uVar5 = (ulong)(uint)ra->size;
  if (ra->size < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    iVar2 = container_size_in_bytes(ra->containers[uVar3],ra->typecodes[uVar3]);
    sVar4 = sVar4 + (long)iVar2;
  }
  return sVar4;
}

Assistant:

size_t ra_portable_size_in_bytes(const roaring_array_t *ra) {
    size_t count = ra_portable_header_size(ra);

    for (int32_t k = 0; k < ra->size; ++k) {
        count += container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
    }
    return count;
}